

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::equal(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
        *this,intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
              *that)

{
  type_conflict4 tVar1;
  bool bVar2;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_78;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_60;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_48;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_30;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  *local_18;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  *that_local;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  local_18 = that;
  that_local = this;
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                      *)this,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                              *)that);
  if (!tVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/intersect_iterator.hpp"
                  ,0xea,
                  "bool burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>>>, std::greater<void>>::equal(const intersect_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>>>, Compare = std::greater<void>]"
                 );
  }
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&local_30,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&local_48,&this->m_end);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&local_60,&local_18->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&local_78,&local_18->m_end);
  bVar2 = std::
          equal<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>,burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
                    (&local_30,&local_48,&local_60,&local_78);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::~owning_iterator(&local_78);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::~owning_iterator(&local_60);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::~owning_iterator(&local_48);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::~owning_iterator(&local_30);
  return bVar2;
}

Assistant:

bool equal (const intersect_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }